

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

void __thiscall
absl::lts_20250127::AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
          (lts_20250127 *this,StringifySink *sink,Hex hex)

{
  string_view local_78;
  string_view local_68;
  size_t local_58;
  size_t real_width;
  char *end;
  char buffer [32];
  StringifySink *sink_local;
  Hex hex_local;
  
  real_width = (size_t)(buffer + 0x18);
  local_58 = numbers_internal::FastHexToBufferZeroPad16((uint64_t)sink,buffer + 8);
  if (local_58 < (hex.value & 0xff)) {
    hex_local.value._1_1_ = hex.value._1_1_;
    memset((void *)(real_width - 0x20),(uint)hex_local.value._1_1_,0x10);
    memset((void *)((real_width - local_58) + -0x10),(uint)hex_local.value._1_1_,0x10);
    hex_local.value._0_1_ = (byte)hex.value;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,(char *)(real_width - (long)(int)(uint)(byte)hex_local.value),
               hex.value & 0xff);
    strings_internal::StringifySink::Append((StringifySink *)this,local_78);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,(char *)(real_width - local_58),local_58);
    strings_internal::StringifySink::Append((StringifySink *)this,local_68);
  }
  return;
}

Assistant:

void AbslStringify(S& sink, Hex hex) {
    static_assert(
        numbers_internal::kFastToBufferSize >= 32,
        "This function only works when output buffer >= 32 bytes long");
    char buffer[numbers_internal::kFastToBufferSize];
    char* const end = &buffer[numbers_internal::kFastToBufferSize];
    auto real_width =
        absl::numbers_internal::FastHexToBufferZeroPad16(hex.value, end - 16);
    if (real_width >= hex.width) {
      sink.Append(absl::string_view(end - real_width, real_width));
    } else {
      // Pad first 16 chars because FastHexToBufferZeroPad16 pads only to 16 and
      // max pad width can be up to 20.
      std::memset(end - 32, hex.fill, 16);
      // Patch up everything else up to the real_width.
      std::memset(end - real_width - 16, hex.fill, 16);
      sink.Append(absl::string_view(end - hex.width, hex.width));
    }
  }